

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndiciRandom.cpp
# Opt level: O1

void __thiscall
IndiciRandom::generaIndici
          (IndiciRandom *this,unsigned_short *risultato,unsigned_short nIndiciGenerati)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  short sVar6;
  uniform_int_distribution<int> local_40;
  ulong local_38;
  
  if ((ushort)(nIndiciGenerati - 1) < this->dimensione) {
    uVar3 = 1;
    if (1 < nIndiciGenerati) {
      uVar3 = nIndiciGenerati;
    }
    local_38 = (ulong)uVar3;
    sVar6 = -1;
    uVar5 = 0;
    do {
      uVar3 = sVar6 + this->dimensione;
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = (int)uVar3;
      uVar4 = std::uniform_int_distribution<int>::operator()
                        (&local_40,&this->random->gen,&local_40._M_param);
      puVar2 = this->vettoreIndici;
      uVar1 = puVar2[uVar4 & 0xffff];
      puVar2[uVar4 & 0xffff] = puVar2[uVar3];
      puVar2[uVar3] = uVar1;
      risultato[uVar5] = uVar1;
      uVar5 = uVar5 + 1;
      sVar6 = sVar6 + -1;
    } while (local_38 != uVar5);
  }
  return;
}

Assistant:

void IndiciRandom::generaIndici(unsigned short risultato[], unsigned short nIndiciGenerati) {
	if (nIndiciGenerati > dimensione) return;

	unsigned short ran, tmp, dim;

	for (int k = 0; k < nIndiciGenerati; k++) {
		dim = dimensione - 1 - k;
		ran = random->randIntU(0, dim);
		tmp = vettoreIndici[ran];
		vettoreIndici[ran] = vettoreIndici[dim];
		vettoreIndici[dim] = tmp;

		risultato[k] = vettoreIndici[dim];
	}
}